

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

CPAccessResult access_lorid(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  uint64_t uVar2;
  
  if (((env->features & 0x200000000) != 0) && (((env->cp15).scr_el3 & 1) == 0)) {
    return CP_ACCESS_OK;
  }
  iVar1 = arm_current_el(env);
  if (iVar1 < 2) {
    uVar2 = arm_hcr_el2_eff_aarch64(env);
    if ((uVar2 >> 0x23 & 1) != 0) {
      return CP_ACCESS_TRAP_EL2;
    }
  }
  else if (iVar1 != 2) {
    return CP_ACCESS_OK;
  }
  if (((env->cp15).scr_el3 & 0x4000) == 0) {
    return CP_ACCESS_OK;
  }
  return CP_ACCESS_TRAP_EL3;
}

Assistant:

static inline bool arm_is_secure_below_el3(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        return !(env->cp15.scr_el3 & SCR_NS);
    } else {
        /* If EL3 is not supported then the secure state is implementation
         * defined, in which case QEMU defaults to non-secure.
         */
        return false;
    }
}